

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseEngine.cpp
# Opt level: O0

impl_schema_type *
PrepareSchema(impl_schema_type *__return_storage_ptr__,api_schema_type *raw_schema)

{
  const_iterator __first;
  const_iterator __last;
  api_schema_type *raw_schema_local;
  impl_schema_type *schema;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
  ::map(__return_storage_ptr__);
  __first = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>
            ::begin(raw_schema);
  __last = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>
           ::end(raw_schema);
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,database::QueryDataType>>,PrepareSchema(std::map<std::__cxx11::string,database::QueryDataType,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,database::QueryDataType>>>const&)::__0>
            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>
              )__last._M_node,(anon_class_8_1_6b0526df)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

database::impl_schema_type PrepareSchema(const database::api_schema_type& raw_schema)
{
  database::impl_schema_type schema;
  std::for_each(raw_schema.begin(),raw_schema.end(),[&](auto pair) {
    switch (pair.second)
    {
      case database::integer: schema[pair.first] = database::numeric; break;
      case database::string: schema[pair.first] = database::non_numeric; break;
      case database::boolean: schema[pair.first] = database::non_numeric; break;
      case database::date: schema[pair.first] = database::numeric; break;
      default: break;
    }
  });
  return schema;
}